

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O0

void anon_unknown.dwarf_2378a8::waves(Array2D<Imf_3_2::Rgba> *pixels,int w,int h)

{
  Rgba *pRVar1;
  int in_EDX;
  int in_ESI;
  Array2D<Imf_3_2::Rgba> *in_RDI;
  double dVar2;
  Rgba *p;
  int x;
  int y;
  float f;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < in_EDX; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      pRVar1 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](in_RDI,(long)local_14);
      pRVar1 = pRVar1 + local_18;
      dVar2 = sin((double)local_18 * 0.1 + (double)local_14 * 0.1);
      sin((double)local_18 * -0.1 + (double)local_14 * 0.2);
      f = (float)((ulong)(dVar2 * 0.5 + 0.5) >> 0x20);
      Imath_3_2::half::operator=(&pRVar1->r,f);
      (pRVar1->g)._h = (pRVar1->r)._h;
      (pRVar1->b)._h = (pRVar1->r)._h;
      sin((double)local_18 * 1.1 + (double)local_14 * 0.5);
      Imath_3_2::half::operator=(&pRVar1->r,f);
    }
  }
  return;
}

Assistant:

void
waves (Array2D<Rgba>& pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];

            p.r = (0.5 + 0.5 * sin (0.1 * x + 0.1 * y)) +
                  (0.5 + 0.5 * sin (-0.1 * x + 0.2 * y));

            p.g = p.r;
            p.b = p.r;

            p.a = (0.5 + 0.5 * sin (1.1 * x + 0.5 * y));
        }
    }
}